

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tile.cpp
# Opt level: O3

Tile * __thiscall Tile::flipY(Tile *this)

{
  bool bVar1;
  bool bVar2;
  Tile *pTVar3;
  Tile *pTVar4;
  uchar *puVar5;
  long lVar6;
  uchar *puVar7;
  uchar *puVar8;
  long lVar9;
  
  pTVar4 = (Tile *)operator_new(0x50);
  bVar1 = this->flipped_x;
  bVar2 = this->is_duplicate;
  pTVar3 = this->original_tile;
  pTVar4->id = this->id;
  pTVar4->flipped_x = bVar1;
  pTVar4->flipped_y = true;
  pTVar4->is_duplicate = bVar2;
  pTVar4->original_tile = pTVar3;
  puVar5 = pTVar4->data;
  puVar7 = this->data + 0x38;
  lVar6 = 0;
  do {
    lVar9 = 0;
    puVar8 = puVar7;
    do {
      puVar5[lVar9 * 8] = *puVar8;
      lVar9 = lVar9 + 1;
      puVar8 = puVar8 + -8;
    } while (lVar9 != 8);
    lVar6 = lVar6 + 1;
    puVar7 = puVar7 + 1;
    puVar5 = puVar5 + 1;
  } while (lVar6 != 8);
  return pTVar4;
}

Assistant:

Tile *Tile::flipY() {
    Tile *flipped_tile = new Tile(id, flipped_x, true, is_duplicate, original_tile);

    for (int x = 0; x < TILE_WIDTH; x++) {
        for (int y = 0; y < TILE_HEIGHT; y++) {
            flipped_tile->data[y * TILE_WIDTH + x] = data[(TILE_HEIGHT - 1 - y) * TILE_WIDTH + x];
        }
    }

    return flipped_tile;
}